

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O0

string * __thiscall
glcts::(anonymous_namespace)::test_api::GL::glslVer_abi_cxx11_
          (string *__return_storage_ptr__,GL *this,bool compute)

{
  allocator<char> local_25 [19];
  allocator<char> local_12;
  byte local_11;
  string *psStack_10;
  bool compute_local;
  
  local_11 = (byte)this & 1;
  psStack_10 = __return_storage_ptr__;
  if (((ulong)this & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"#version 400",local_25);
    std::allocator<char>::~allocator(local_25);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"#version 430",&local_12);
    std::allocator<char>::~allocator(&local_12);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string glslVer(bool compute = false)
	{
		if (compute)
		{
			return "#version 430";
		}
		else
		{
			return "#version 400";
		}
	}